

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O2

bool leveldb::GetInternalKey(Slice *input,InternalKey *dst)

{
  bool bVar1;
  Slice str;
  Slice local_18;
  
  local_18.data_ = "";
  local_18.size_ = 0;
  bVar1 = GetLengthPrefixedSlice(input,&local_18);
  if (bVar1) {
    bVar1 = InternalKey::DecodeFrom(dst,&local_18);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool GetInternalKey(Slice* input, InternalKey* dst) {
  Slice str;
  if (GetLengthPrefixedSlice(input, &str)) {
    return dst->DecodeFrom(str);
  } else {
    return false;
  }
}